

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O0

int run_test_udp_connect(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined4 local_170;
  int local_16c;
  int addrlen;
  int r;
  sockaddr_in tmp_addr;
  sockaddr_in ext_addr;
  uv_udp_send_t req;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&lo_addr);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x6b,"0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &lo_addr)");
    abort();
  }
  uVar2 = uv_default_loop();
  local_16c = uv_udp_init(uVar2,&server);
  if (local_16c != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x6e,"r == 0");
    abort();
  }
  local_16c = uv_udp_bind(&server,&lo_addr,0);
  if (local_16c != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x71,"r == 0");
    abort();
  }
  local_16c = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
  if (local_16c != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x74,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  local_16c = uv_udp_init(uVar2,&client);
  if (local_16c != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x77,"r == 0");
    abort();
  }
  buf = (uv_buf_t)uv_buf_init("EXIT",4);
  iVar1 = uv_ip4_addr("8.8.8.8",0x23a3,tmp_addr.sin_zero);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x7b,"0 == uv_ip4_addr(\"8.8.8.8\", TEST_PORT, &ext_addr)");
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&lo_addr);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x7c,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &lo_addr)");
    abort();
  }
  local_16c = uv_udp_connect(&client,&lo_addr);
  if (local_16c != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x7f,"r == 0");
    abort();
  }
  local_16c = uv_udp_connect(&client,tmp_addr.sin_zero);
  if (local_16c != -0x6a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x81,"r == UV_EISCONN");
    abort();
  }
  local_170 = 0x10;
  local_16c = uv_udp_getpeername(&client,&addrlen,&local_170);
  if (local_16c != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x85,"r == 0");
    abort();
  }
  local_16c = uv_udp_try_send(&client,&buf,1,&lo_addr);
  if (local_16c != -0x6a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x89,"r == UV_EISCONN");
    abort();
  }
  local_16c = uv_udp_try_send(&client,&buf,1,0);
  if (local_16c != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x8b,"r == 4");
    abort();
  }
  local_16c = uv_udp_try_send(&client,&buf,1,tmp_addr.sin_zero);
  if (local_16c != -0x6a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x8d,"r == UV_EISCONN");
    abort();
  }
  local_16c = uv_udp_connect(&client,0);
  if (local_16c != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x90,"r == 0");
    abort();
  }
  local_16c = uv_udp_connect(&client,0);
  if (local_16c != -0x6b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x92,"r == UV_ENOTCONN");
    abort();
  }
  local_170 = 0x10;
  local_16c = uv_udp_getpeername(&client,&addrlen,&local_170);
  if (local_16c != -0x6b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x96,"r == UV_ENOTCONN");
    abort();
  }
  local_16c = uv_udp_try_send(&client,&buf,1,&lo_addr);
  if (local_16c != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x9a,"r == 4");
    abort();
  }
  local_16c = uv_udp_try_send(&client,&buf,1,0);
  if (local_16c != -0x59) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0x9c,"r == UV_EDESTADDRREQ");
    abort();
  }
  local_16c = uv_udp_connect(&client,&lo_addr);
  if (local_16c != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0xa0,"r == 0");
    abort();
  }
  local_16c = uv_udp_send(ext_addr.sin_zero,&client,&buf,1,&lo_addr,cl_send_cb);
  if (local_16c != -0x6a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0xa7,"r == UV_EISCONN");
    abort();
  }
  local_16c = uv_udp_send(ext_addr.sin_zero,&client,&buf,1,0,cl_send_cb);
  if (local_16c != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0xa9,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0xad,"close_cb_called == 2");
    abort();
  }
  if (sv_recv_cb_called != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0xae,"sv_recv_cb_called == 4");
    abort();
  }
  if (cl_send_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0xaf,"cl_send_cb_called == 2");
    abort();
  }
  if (client.send_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0xb1,"client.send_queue_size == 0");
    abort();
  }
  if (server.send_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0xb2,"server.send_queue_size == 0");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
            ,0xb4,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(udp_connect) {
  uv_udp_send_t req;
  struct sockaddr_in ext_addr;
  struct sockaddr_in tmp_addr;
  int r;
  int addrlen;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &lo_addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &lo_addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("EXIT", 4);

  ASSERT(0 == uv_ip4_addr("8.8.8.8", TEST_PORT, &ext_addr));
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &lo_addr));

  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == 0);

  /* To send messages in connected UDP sockets addr must be NULL */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  r = uv_udp_connect(&client, NULL);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, NULL);
  ASSERT(r == UV_ENOTCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == UV_ENOTCONN);

  /* To send messages in disconnected UDP sockets addr must be set */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == UV_EDESTADDRREQ);


  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &lo_addr,
                  cl_send_cb);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_send(&req, &client, &buf, 1, NULL, cl_send_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);
  ASSERT(sv_recv_cb_called == 4);
  ASSERT(cl_send_cb_called == 2);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}